

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# migrate.cpp
# Opt level: O2

void __thiscall wallet::InternalRecord::Unserialize<AutoFile>(InternalRecord *this,AutoFile *s)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  pointer pbVar4;
  uint8_t uVar5;
  uint32_t uVar6;
  size_t in_RCX;
  long in_FS_OFFSET;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = ser_readdata8<AutoFile>(s);
  this->unused = uVar5;
  uVar6 = ser_readdata32<AutoFile>(s);
  this->page_num = uVar6;
  uVar6 = ser_readdata32<AutoFile>(s);
  this->records = uVar6;
  std::vector<std::byte,_std::allocator<std::byte>_>::resize
            (&this->data,(ulong)(this->m_header).len);
  pbVar4 = (this->data).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_start;
  AutoFile::read(s,(int)pbVar4,
                 (this->data).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_finish + -(long)pbVar4,in_RCX);
  if ((this->m_header).other_endian == true) {
    uVar1 = this->page_num;
    uVar2 = this->records;
    this->page_num = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18
    ;
    this->records = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream& s)
    {
        s >> unused;
        s >> page_num;
        s >> records;

        data.resize(m_header.len);
        s.read(AsWritableBytes(Span(data.data(), data.size())));

        if (m_header.other_endian) {
            page_num = internal_bswap_32(page_num);
            records = internal_bswap_32(records);
        }
    }